

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-thread.c
# Opt level: O2

void tls_thread(void *arg)

{
  long lVar1;
  void *pvVar2;
  undefined8 uVar3;
  char *pcVar4;
  
  lVar1 = uv_key_get(&tls_key);
  if (lVar1 == 0) {
    uv_key_set(&tls_key,arg);
    pvVar2 = (void *)uv_key_get(&tls_key);
    if (pvVar2 == arg) {
      uv_key_set(&tls_key,0);
      lVar1 = uv_key_get(&tls_key);
      if (lVar1 == 0) {
        return;
      }
      pcVar4 = "NULL == uv_key_get(&tls_key)";
      uVar3 = 0xc0;
    }
    else {
      pcVar4 = "arg == uv_key_get(&tls_key)";
      uVar3 = 0xbe;
    }
  }
  else {
    pcVar4 = "NULL == uv_key_get(&tls_key)";
    uVar3 = 0xbc;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-thread.c"
          ,uVar3,pcVar4);
  abort();
}

Assistant:

static void tls_thread(void* arg) {
  ASSERT(NULL == uv_key_get(&tls_key));
  uv_key_set(&tls_key, arg);
  ASSERT(arg == uv_key_get(&tls_key));
  uv_key_set(&tls_key, NULL);
  ASSERT(NULL == uv_key_get(&tls_key));
}